

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  MapEntryMessageComparator MVar1;
  int iVar2;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *this;
  bool bVar3;
  int iVar4;
  Descriptor *pDVar5;
  MessageFactory *pMVar6;
  undefined4 extraout_var;
  MapKey *key;
  FieldDescriptor *pFVar7;
  MapValueRef *value;
  iterator __first;
  iterator __last;
  MapEntryMessageComparator local_100;
  MapEntryMessageComparator comparator;
  Message *map_entry_message;
  undefined1 local_a8 [8];
  MapIterator iter;
  Message *prototype;
  Descriptor *map_entry_desc;
  int local_44;
  RepeatedPtrField<google::protobuf::Message> *pRStack_40;
  int i;
  RepeatedPtrField<google::protobuf::Message> *map_field;
  MapFieldBase *base;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *pvStack_28;
  bool need_release;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *sorted_map_field_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  
  base._7_1_ = 0;
  pvStack_28 = sorted_map_field;
  sorted_map_field_local =
       (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  map_field = (RepeatedPtrField<google::protobuf::Message> *)
              Reflection::GetMapData(reflection,message,field);
  bVar3 = MapFieldBase::IsRepeatedFieldValid((MapFieldBase *)map_field);
  if (bVar3) {
    pRStack_40 = Reflection::GetRepeatedPtrFieldInternal<google::protobuf::Message>
                           ((Reflection *)field_local,(Message *)reflection_local,
                            (FieldDescriptor *)sorted_map_field_local);
    for (local_44 = 0; iVar2 = local_44,
        iVar4 = RepeatedPtrField<google::protobuf::Message>::size(pRStack_40), this = pvStack_28,
        iVar2 < iVar4; local_44 = local_44 + 1) {
      map_entry_desc =
           (Descriptor *)RepeatedPtrField<google::protobuf::Message>::Mutable(pRStack_40,local_44);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::push_back(this,(value_type *)&map_entry_desc);
    }
  }
  else {
    pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)sorted_map_field_local);
    pMVar6 = Reflection::GetMessageFactory((Reflection *)field_local);
    iter.value_.super_MapValueConstRef.type_ = (*pMVar6->_vptr_MessageFactory[2])(pMVar6,pDVar5);
    iter.value_.super_MapValueConstRef._12_4_ = extraout_var;
    Reflection::MapBegin
              ((MapIterator *)local_a8,(Reflection *)field_local,(Message *)reflection_local,
               (FieldDescriptor *)sorted_map_field_local);
    while( true ) {
      Reflection::MapEnd((MapIterator *)&map_entry_message,(Reflection *)field_local,
                         (Message *)reflection_local,(FieldDescriptor *)sorted_map_field_local);
      bVar3 = protobuf::operator!=((MapIterator *)local_a8,(MapIterator *)&map_entry_message);
      if (!bVar3) break;
      comparator.field_ =
           (FieldDescriptor *)Message::New((Message *)iter.value_.super_MapValueConstRef._8_8_);
      key = MapIterator::GetKey((MapIterator *)local_a8);
      MVar1.field_ = comparator.field_;
      pFVar7 = Descriptor::field(pDVar5,0);
      CopyKey(key,(Message *)MVar1.field_,pFVar7);
      value = MapIterator::GetValueRef((MapIterator *)local_a8);
      MVar1 = comparator;
      pFVar7 = Descriptor::field(pDVar5,1);
      CopyValue(value,(Message *)MVar1.field_,pFVar7);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::push_back(pvStack_28,(value_type *)&comparator);
      MapIterator::operator++((MapIterator *)local_a8);
    }
    base._7_1_ = 1;
  }
  pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)sorted_map_field_local);
  MapEntryMessageComparator::MapEntryMessageComparator(&local_100,pDVar5);
  __first = std::
            vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ::begin(pvStack_28);
  __last = std::
           vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           ::end(pvStack_28);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,google::protobuf::MapEntryMessageComparator>
            ((__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
              )__last._M_current,local_100);
  return (bool)(base._7_1_ & 1);
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrFieldInternal<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO: For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype =
        reflection->GetMessageFactory()->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}